

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractlistview.hpp
# Opt level: O1

void __thiscall
QtMWidgets::AbstractListView<QColor>::dataChanged(AbstractListView<QColor> *this,int first,int last)

{
  AbstractScrollAreaPrivate *pAVar1;
  AbstractScrollArea *this_00;
  QRect QVar2;
  
  pAVar1 = (this->super_AbstractListViewBase).super_AbstractScrollArea.d.d;
  (**(code **)(*(long *)&(this->super_AbstractListViewBase).super_AbstractScrollArea + 0x1b8))();
  if (first <= last) {
    this_00 = pAVar1->q;
    do {
      QVar2 = visualRect((AbstractListView<QColor> *)this_00,first);
      if ((QVar2.x1 + -1 != QVar2.x2) || (QVar2.y1 + -1 != QVar2.y2)) {
        QWidget::update();
        return;
      }
      first = first + 1;
    } while (last + 1 != first);
  }
  return;
}

Assistant:

void dataChanged( int first, int last ) override
	{
		AbstractListViewPrivate< T > * d = d_func();

		recalculateSize();

		d->updateIfNeeded( first, last );
	}